

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void hta::
     throw_exception<hta::Exception,char_const*,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
               (char *args,duration<long,_std::ratio<1L,_1000000000L>_> args_1)

{
  Exception *this;
  string local_1e0;
  rep local_1b0;
  make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_1a1
  ;
  stringstream local_1a0 [8];
  stringstream msg;
  char *args_local;
  duration<long,_std::ratio<1L,_1000000000L>_> args_local_1;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1b0 = args_1.__r;
  detail::make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::
  operator()(&local_1a1,(stringstream *)local_1a0,args,args_1);
  this = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  Exception::Exception(this,&local_1e0);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}